

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O0

RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults> * __thiscall
capnp::RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>::operator=
          (RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults> *this,
          RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults> *other)

{
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults> *other_local;
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults> *this_local;
  
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>_>::
  operator=(&this->
             super_Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>_>
            ,&other->
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>_>
           );
  capnproto_test::capnp::test::TestMoreStuff::GetHandleResults::Pipeline::operator=
            (&this->super_Pipeline,&other->super_Pipeline);
  return this;
}

Assistant:

RemotePromise& operator=(RemotePromise&& other) = default;